

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ReflectionPayload *
google::protobuf::Arena::
Create<google::protobuf::internal::MapFieldBase::ReflectionPayload,google::protobuf::Arena*&>
          (Arena *arena,Arena **args)

{
  Arena *pAVar1;
  ReflectionPayload *pRVar2;
  
  if (arena == (Arena *)0x0) {
    pRVar2 = (ReflectionPayload *)operator_new(0x28);
  }
  else {
    pRVar2 = (ReflectionPayload *)
             AllocateInternal<google::protobuf::internal::MapFieldBase::ReflectionPayload,false>
                       (arena);
  }
  pAVar1 = *args;
  (pRVar2->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  (pRVar2->repeated_field).super_RepeatedPtrFieldBase.current_size_ = 0;
  (pRVar2->repeated_field).super_RepeatedPtrFieldBase.capacity_proxy_ = 0;
  (pRVar2->repeated_field).super_RepeatedPtrFieldBase.arena_ = pAVar1;
  (pRVar2->mutex).mu_.super___atomic_base<long>._M_i = 0;
  (pRVar2->state)._M_i = STATE_MODIFIED_MAP;
  return pRVar2;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  Create(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    if constexpr (is_arena_constructable<T>::value) {
      using Type = std::remove_const_t<T>;
      // DefaultConstruct/CopyConstruct are optimized for messages, which
      // are both arena constructible and destructor skippable and they
      // assume much. Don't use these functions unless the invariants
      // hold.
      if constexpr (is_destructor_skippable<T>::value) {
        constexpr auto construct_type = GetConstructType<T, Args&&...>();
        // We delegate to DefaultConstruct/CopyConstruct where appropriate
        // because protobuf generated classes have external templates for
        // these functions for code size reasons. When `if constexpr` is not
        // available always use the fallback.
        if constexpr (construct_type == ConstructType::kDefault) {
          return static_cast<Type*>(DefaultConstruct<Type>(arena));
        } else if constexpr (construct_type == ConstructType::kCopy) {
          return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
        }
      }
      return CreateArenaCompatible<Type>(arena, std::forward<Args>(args)...);
    } else {
      if (ABSL_PREDICT_FALSE(arena == nullptr)) {
        return new T(std::forward<Args>(args)...);
      }
      return new (arena->AllocateInternal<T>()) T(std::forward<Args>(args)...);
    }
  }